

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

Vector3f __thiscall
Renderer::estimatePixel(Renderer *this,Ray *ray,float tmin,float length,int iters)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  Vector3f VVar1;
  Vector3f color;
  float local_74;
  Renderer *local_70;
  float local_68;
  Vector3f local_64;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_74 = tmin;
  local_70 = this;
  local_68 = length;
  Vector3f::Vector3f(&local_64,0.0);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(Ray **)local_58._M_unused._0_8_ = ray;
  *(ulong *)((long)local_58._M_unused._0_8_ + 8) = CONCAT44(in_register_00000014,iters);
  *(float **)((long)local_58._M_unused._0_8_ + 0x10) = &local_74;
  *(float **)((long)local_58._M_unused._0_8_ + 0x18) = &local_68;
  *(Vector3f **)((long)local_58._M_unused._0_8_ + 0x20) = &local_64;
  pcStack_40 = std::
               _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Renderer.cpp:28:25)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/Renderer.cpp:28:25)>
             ::_M_manager;
  parallel_for(in_ECX,(function<void_(int,_int)> *)&local_58,100.0 < local_68);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  VVar1 = operator/(&local_64,(float)(int)in_ECX);
  return (Vector3f)VVar1.m_elements;
}

Assistant:

Vector3f Renderer::estimatePixel(const Ray &ray, float tmin, float length, int iters) {
    // Average over multiple iterations.
    Vector3f color;
    parallel_for(iters, [&](int start, int end) {
        for (int i = start; i < end; i++) {
            // 1. Choose a light
            std::default_random_engine generator(rand());
            std::uniform_int_distribution<int> uniform(0, _scene.lights.size() - 1);
            Object3D *light = _scene.lights[uniform(generator)];

            float prob_path = 1;

            std::vector<Ray> eye_path;
            std::vector<Ray> light_path;
            std::vector<Hit> eye_hits;
            std::vector<Hit> light_hits;

            choosePath(ray, light, tmin, length, prob_path, eye_path, eye_hits, light_path, light_hits);
            Vector3f path_color = colorPath(tmin, light, eye_path, eye_hits, light_path, light_hits);
            color += path_color;
        }
    }, length > 100);
    return color / (float) iters;
}